

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5HashNew(Fts5Config *pConfig,Fts5Hash **ppNew,int *pnByte)

{
  Fts5Hash *__s;
  sqlite3_uint64 n;
  Fts5HashEntry **ppFVar1;
  sqlite3_int64 nByte;
  Fts5Hash *pNew;
  int rc;
  int *pnByte_local;
  Fts5Hash **ppNew_local;
  Fts5Config *pConfig_local;
  
  pNew._4_4_ = 0;
  __s = (Fts5Hash *)sqlite3_malloc(0x28);
  *ppNew = __s;
  if (__s == (Fts5Hash *)0x0) {
    pNew._4_4_ = 7;
  }
  else {
    memset(__s,0,0x28);
    __s->pnByte = pnByte;
    __s->eDetail = pConfig->eDetail;
    __s->nSlot = 0x400;
    n = (long)__s->nSlot << 3;
    ppFVar1 = (Fts5HashEntry **)sqlite3_malloc64(n);
    __s->aSlot = ppFVar1;
    if (__s->aSlot == (Fts5HashEntry **)0x0) {
      sqlite3_free(__s);
      *ppNew = (Fts5Hash *)0x0;
      pNew._4_4_ = 7;
    }
    else {
      memset(__s->aSlot,0,n);
    }
  }
  return pNew._4_4_;
}

Assistant:

static int sqlite3Fts5HashNew(Fts5Config *pConfig, Fts5Hash **ppNew, int *pnByte){
  int rc = SQLITE_OK;
  Fts5Hash *pNew;

  *ppNew = pNew = (Fts5Hash*)sqlite3_malloc(sizeof(Fts5Hash));
  if( pNew==0 ){
    rc = SQLITE_NOMEM;
  }else{
    sqlite3_int64 nByte;
    memset(pNew, 0, sizeof(Fts5Hash));
    pNew->pnByte = pnByte;
    pNew->eDetail = pConfig->eDetail;

    pNew->nSlot = 1024;
    nByte = sizeof(Fts5HashEntry*) * pNew->nSlot;
    pNew->aSlot = (Fts5HashEntry**)sqlite3_malloc64(nByte);
    if( pNew->aSlot==0 ){
      sqlite3_free(pNew);
      *ppNew = 0;
      rc = SQLITE_NOMEM;
    }else{
      memset(pNew->aSlot, 0, (size_t)nByte);
    }
  }
  return rc;
}